

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O1

void __thiscall CTcParser::create_scope_local_symtab(CTcParser *this)

{
  CTcPrsSymtab *this_00;
  size_t in_RSI;
  
  if (this->local_symtab_ == this->enclosing_local_symtab_) {
    this_00 = (CTcPrsSymtab *)CTcPrsSymtab::operator_new((CTcPrsSymtab *)0x30,in_RSI);
    CTcPrsSymtab::CTcPrsSymtab(this_00,this->local_symtab_);
    this->local_symtab_ = this_00;
  }
  return;
}

Assistant:

void CTcParser::create_scope_local_symtab()
{
    /* 
     *   if our symbol table is the same as the enclosing symbol table, we
     *   must create our own table 
     */
    if (local_symtab_ == enclosing_local_symtab_)        
    {
        /* 
         *   Create our own local symbol table, replacing the current one
         *   - we saved the enclosing one already when we entered the
         *   scope, so we'll restore it on our way out.  The new local
         *   symbol table has the enclosing symbol table as its parent
         *   scope.  
         */
        local_symtab_ = new CTcPrsSymtab(local_symtab_);
    }
}